

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool flatbuffers::SaveFile(char *name,char *buf,size_t len,bool binary)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char local_230 [8];
  ofstream ofs;
  bool binary_local;
  size_t len_local;
  char *buf_local;
  char *name_local;
  
  _Var2 = _S_out;
  if (binary) {
    _Var2 = _S_bin;
  }
  std::ofstream::ofstream(local_230,name,_Var2);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    name_local._7_1_ = false;
  }
  else {
    std::ostream::write(local_230,(long)buf);
    bVar1 = std::ios::bad();
    name_local._7_1_ = (bool)((bVar1 ^ 0xff) & 1);
  }
  std::ofstream::~ofstream(local_230);
  return name_local._7_1_;
}

Assistant:

bool SaveFile(const char *name, const char *buf, size_t len, bool binary) {
  std::ofstream ofs(name, binary ? std::ofstream::binary : std::ofstream::out);
  if (!ofs.is_open()) return false;
  ofs.write(buf, len);
  return !ofs.bad();
}